

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjpeghandler.cpp
# Opt level: O0

bool write_jpeg_image(QImage *image,QIODevice *device,int sourceQuality,QString *description,
                     bool optimize,bool progressive,bool invertCMYK)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  bool success;
  JSAMPROW row_pointer [1];
  jpeg_compress_struct cinfo;
  undefined1 local_250 [229];
  undefined1 in_stack_fffffffffffffe95;
  undefined1 in_stack_fffffffffffffe96;
  undefined1 in_stack_fffffffffffffe97;
  QString *in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffea4;
  QIODevice *in_stack_fffffffffffffea8;
  QImage *in_stack_fffffffffffffeb0;
  JSAMPROW *in_stack_fffffffffffffeb8;
  jpeg_compress_struct *in_stack_fffffffffffffec0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(local_250,&DAT_00114528,0x248);
  bVar2 = do_write_jpeg_image(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                              in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                              in_stack_fffffffffffffea4,in_stack_fffffffffffffe98,
                              (bool)in_stack_fffffffffffffe97,(bool)in_stack_fffffffffffffe96,
                              (bool)in_stack_fffffffffffffe95);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

static bool write_jpeg_image(const QImage &image,
                             QIODevice *device,
                             int sourceQuality,
                             const QString &description,
                             bool optimize,
                             bool progressive,
                             bool invertCMYK)
{
    // protect these objects from the setjmp/longjmp pair inside
    // do_write_jpeg_image (by making them non-local).
    struct jpeg_compress_struct cinfo;
    JSAMPROW row_pointer[1];
    row_pointer[0] = nullptr;

    const bool success = do_write_jpeg_image(cinfo, row_pointer,
                                             image, device,
                                             sourceQuality, description,
                                             optimize, progressive, invertCMYK);

    delete [] row_pointer[0];
    return success;
}